

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_buffer_stream.h
# Opt level: O2

int __thiscall crnlib::buffer_stream::open(buffer_stream *this,char *__file,int __oflag,...)

{
  undefined1 *puVar1;
  int iVar2;
  
  iVar2 = (*(this->super_data_stream)._vptr_data_stream[3])();
  if (__oflag != 0 && __file != (char *)0x0) {
    puVar1 = &(this->super_data_stream).field_0x1a;
    *puVar1 = *puVar1 | 1;
    this->m_pBuf = (uint8 *)__file;
    this->m_size = __oflag;
    this->m_ofs = 0;
    (this->super_data_stream).m_attribs = 5;
  }
  return CONCAT31((int3)((uint)iVar2 >> 8),__oflag != 0 && __file != (char *)0x0);
}

Assistant:

bool open(const void* p, uint size)
        {
            CRNLIB_ASSERT(p);

            close();

            if ((!p) || (!size))
            {
                return false;
            }

            m_opened = true;
            m_pBuf = (uint8*)(p);
            m_size = size;
            m_ofs = 0;
            m_attribs = cDataStreamSeekable | cDataStreamReadable;
            return true;
        }